

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O1

bool Am_Check_And_Fix_Object_Group(Am_Object *obj,Am_Object *inter,Am_Object *new_owner)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object owner;
  Am_Object old_owner;
  Am_Value_List owner_list;
  Am_Object temp;
  Am_Object curr_owner;
  Am_Object event_window;
  Am_Value v;
  Am_Object local_c0;
  Am_Object local_b8;
  uint local_b0;
  int local_ac;
  Am_Object *local_a8;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value local_50;
  Am_Object *local_40;
  Am_Object local_38;
  
  local_40 = new_owner;
  Am_Object::operator=(new_owner,&Am_No_Object);
  local_a8 = obj;
  Am_Object::Get_Object((Am_Object *)&local_98,(Am_Slot_Key)obj,10);
  Am_Object::Am_Object(&local_58,&Am_Screen);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&local_98,&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object((Am_Object *)&local_98);
  if (bVar1) {
    return true;
  }
  Am_Value_List::Am_Value_List(&local_98);
  local_50.type = 0;
  local_50.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(inter,0x116,1);
  Am_Value::operator=(&local_50,pAVar3);
  bVar1 = Am_Value_List::Test(&local_50);
  bVar2 = true;
  if (!bVar1) goto LAB_001b87ed;
  Am_Value_List::operator=(&local_98,&local_50);
  local_c0.data = (Am_Object_Data *)0x0;
  local_a0.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(inter,0x121,0);
  local_ac = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(inter,0x122,0);
  local_b0 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(inter,0x68,0);
  Am_Object::Am_Object(&local_60,pAVar3);
  local_68.data = (Am_Object_Data *)0x0;
  local_70.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_98);
  while (bVar1 = Am_Value_List::Last(&local_98), !bVar1) {
    pAVar3 = Am_Value_List::Get(&local_98);
    Am_Object::operator=(&local_68,pAVar3);
    Am_Object::Am_Object(&local_38,&local_60);
    bVar1 = Am_Object::Is_Part_Of(&local_68,&local_38);
    if (bVar1) {
      bVar1 = Am_Point_In_All_Owners(&local_68,local_ac,local_b0,&local_60);
      Am_Object::~Am_Object(&local_38);
      if (bVar1) {
        Am_Point_In_Obj(&local_b8,(int)&local_68,local_ac,(Am_Object *)(ulong)local_b0);
        Am_Object::operator=(&local_70,&local_b8);
        Am_Object::~Am_Object(&local_b8);
        bVar1 = Am_Object::Valid(&local_70);
        if (bVar1) {
          bVar2 = Am_Object::Valid(&local_c0);
          bVar1 = true;
          if (bVar2) {
            Am_Object::Am_Object(&local_78,&local_c0);
            bVar1 = Am_Object::Is_Part_Of(&local_68,&local_78);
            Am_Object::~Am_Object(&local_78);
          }
          if (bVar1 != false) {
            Am_Object::operator=(&local_c0,&local_68);
          }
        }
      }
    }
    else {
      Am_Object::~Am_Object(&local_38);
    }
    Am_Value_List::Next(&local_98);
  }
  bVar1 = Am_Object::Valid(&local_c0);
  if (bVar1) {
    Am_Object::operator=(local_40,&local_c0);
    Am_Object::Get_Object(&local_b8,(Am_Slot_Key)local_a8,10);
    Am_Object::operator=(&local_a0,&local_b8);
    Am_Object::~Am_Object(&local_b8);
    bVar1 = Am_Object::operator!=(&local_c0,&local_a0);
    bVar2 = true;
    if (bVar1) {
      Am_Object::Am_Object(&local_80,local_a8);
      bVar1 = Am_Object::Is_Part_Of(&local_c0,&local_80);
      Am_Object::~Am_Object(&local_80);
      if (bVar1) goto LAB_001b87b9;
      Am_Object::Remove_From_Owner(local_a8);
      Am_Object::Am_Object(&local_88,local_a8);
      Am_Object::Add_Part(&local_c0,&local_88,true,0);
      Am_Object::~Am_Object(&local_88);
    }
  }
  else {
LAB_001b87b9:
    bVar2 = false;
  }
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_c0);
LAB_001b87ed:
  Am_Value::~Am_Value(&local_50);
  Am_Value_List::~Am_Value_List(&local_98);
  return bVar2;
}

Assistant:

bool
Am_Check_And_Fix_Object_Group(Am_Object &obj, const Am_Object &inter,
                              Am_Object &new_owner)
{
  new_owner = Am_No_Object;
  // if we are moving a top-level window, don't need to do anything
  if (obj.Get_Owner().Is_Instance_Of(Am_Screen))
    return true;

  Am_Value_List owner_list;
  Am_Value v;
  v = inter.Peek(Am_MULTI_OWNERS);
  if (Am_Value_List::Test(v))
    owner_list = v;
  else
    return true; //otherwise, leave in original window

  Am_Object owner, old_owner;
  int x = inter.Get(Am_INTERIM_X);
  int y = inter.Get(Am_INTERIM_Y);
  Am_Object event_window = inter.Get(Am_WINDOW);

  Am_Object curr_owner, temp;
  for (owner_list.Start(); !owner_list.Last(); owner_list.Next()) {
    curr_owner = owner_list.Get();
    if (curr_owner.Is_Part_Of(event_window) &&
        Am_Point_In_All_Owners(curr_owner, x, y, event_window)) {
      temp = Am_Point_In_Obj(curr_owner, x, y, event_window);
      if (temp.Valid()) {
        if (!owner.Valid() || curr_owner.Is_Part_Of(owner))
          owner = curr_owner;
      }
    }
  }
  if (!owner.Valid())
    return false;
  new_owner = owner;
  old_owner = obj.Get_Owner();
  if (owner != old_owner) {
    if (owner.Is_Part_Of(obj))
      return false;
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "Inter " << inter << " moving object " << obj
                                  << " to new owner " << owner
                                  << " because mouse moved from prev owner "
                                  << old_owner);
    obj.Remove_From_Owner(); // make the object no longer be a part of its old
                             // place
    owner.Add_Part(obj);
  }
  return true;
}